

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context.hpp
# Opt level: O2

return_type __thiscall
asio::io_context::
post<asio::detail::wrapped_handler<asio::io_context::strand,std::function<void()>,asio::detail::is_continuation_if_running>>
          (io_context *this,
          wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>
          *handler)

{
  bool is_continuation;
  completion_handler<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>_>
  *this_00;
  ptr local_38;
  
  is_continuation = strand::running_in_this_thread(&handler->dispatcher_);
  local_38.h = handler;
  this_00 = detail::
            completion_handler<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>_>
            ::ptr::allocate(handler);
  local_38.p = (completion_handler<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>_>
                *)0x0;
  local_38.v = this_00;
  detail::
  completion_handler<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>_>
  ::completion_handler(this_00,handler);
  local_38.p = this_00;
  detail::scheduler::post_immediate_completion
            (this->impl_,&this_00->super_operation,is_continuation);
  local_38.v = (completion_handler<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>_>
                *)0x0;
  local_38.p = (completion_handler<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>_>
                *)0x0;
  detail::
  completion_handler<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>_>
  ::ptr::~ptr(&local_38);
  return;
}

Assistant:

io_context::post(ASIO_MOVE_ARG(LegacyCompletionHandler) handler)
{
  // If you get an error on the following line it means that your handler does
  // not meet the documented type requirements for a LegacyCompletionHandler.
  ASIO_LEGACY_COMPLETION_HANDLER_CHECK(
      LegacyCompletionHandler, handler) type_check;

  async_completion<LegacyCompletionHandler, void ()> init(handler);

  bool is_continuation =
    asio_handler_cont_helpers::is_continuation(init.completion_handler);

  // Allocate and construct an operation to wrap the handler.
  typedef detail::completion_handler<
    typename handler_type<LegacyCompletionHandler, void ()>::type> op;
  typename op::ptr p = { detail::addressof(init.completion_handler),
      op::ptr::allocate(init.completion_handler), 0 };
  p.p = new (p.v) op(init.completion_handler);

  ASIO_HANDLER_CREATION((*this, *p.p,
        "io_context", this, 0, "post"));

  impl_.post_immediate_completion(p.p, is_continuation);
  p.v = p.p = 0;

  return init.result.get();
}